

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O2

int sort_5_4::insert_b_sort_1(int *a,int n)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  
  lVar2 = -1;
  lVar3 = 0;
  do {
    iVar1 = a[lVar3];
    iVar4 = (int)lVar3 + -1;
    uVar7 = 0;
    while ((int)uVar7 <= iVar4) {
      uVar6 = uVar7 + iVar4 >> 1;
      if (iVar1 < a[uVar6]) {
        uVar7 = uVar6 + 1;
      }
      else {
        iVar4 = uVar6 - 1;
      }
    }
    for (lVar5 = lVar2; (long)(ulong)uVar7 <= lVar5; lVar5 = lVar5 + -1) {
      a[lVar5 + 1] = a[lVar5];
    }
    a[uVar7] = iVar1;
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

int insert_b_sort_1(int *a, int n) {
        int mid, low, high, t;
        for (int i = 0; i < n; i++) {
            low = 0, high = i - 1, t = a[i];
            while (low <= high) {
                mid = (low + high) / 2;
//                if (t < a[mid])
//                    high = mid - 1;
//                else
//                    low = mid + 1;
                if (t < a[mid])
                    low = mid + 1;
                else
                    high = mid - 1;
            }

            for (int j = i - 1; j >= low; j--)
                a[j + 1] = a[j];
            a[low] = t;
        }
    }